

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O1

void __thiscall
tst_SerialiserCommon::saveLoadByteArray
          (tst_SerialiserCommon *this,AbstractModelSerialiser *serialiser,
          QAbstractItemModel *sourceModel,QAbstractItemModel *destinationModel,bool multiRole,
          bool checkHeaders)

{
  bool bVar1;
  char cVar2;
  undefined7 in_register_00000081;
  QByteArray dataArray;
  QArrayData *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  QModelIndex local_60;
  QModelIndex local_48;
  
  AbstractModelSerialiser::setModel((QAbstractItemModel *)serialiser);
  if ((int)CONCAT71(in_register_00000081,multiRole) != 0) {
    (**(code **)(*(long *)serialiser + 0x70))(serialiser,0x101);
  }
  local_78 = (QArrayData *)0x0;
  uStack_70 = 0;
  local_68 = 0;
  bVar1 = (bool)(**(code **)(*(long *)serialiser + 0xa8))(serialiser);
  cVar2 = QTest::qVerify(bVar1,"serialiser->saveModel(&dataArray)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                         ,0xe);
  if (cVar2 != '\0') {
    AbstractModelSerialiser::setModel((QAbstractItemModel *)serialiser);
    bVar1 = (bool)(**(code **)(*(long *)serialiser + 0xb8))(serialiser,&local_78);
    cVar2 = QTest::qVerify(bVar1,"serialiser->loadModel(dataArray)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                           ,0x10);
    if (cVar2 != '\0') {
      local_48.r = -1;
      local_48.c = -1;
      local_48.i = 0;
      local_48.m = (QAbstractItemModel *)0x0;
      local_60.r = -1;
      local_60.c = -1;
      local_60.i = 0;
      local_60.m = (QAbstractItemModel *)0x0;
      checkModelEqual(this,sourceModel,destinationModel,&local_48,&local_60,checkHeaders);
    }
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,1,8);
    }
  }
  return;
}

Assistant:

void tst_SerialiserCommon::saveLoadByteArray(AbstractModelSerialiser *serialiser, const QAbstractItemModel *sourceModel,
                                             QAbstractItemModel *destinationModel, bool multiRole, bool checkHeaders) const
{
    serialiser->setModel(sourceModel);
    if (multiRole)
        serialiser->addRoleToSave(Qt::UserRole + 1);
    QByteArray dataArray;
    QVERIFY(serialiser->saveModel(&dataArray));
    serialiser->setModel(destinationModel);
    QVERIFY(serialiser->loadModel(dataArray));
    checkModelEqual(sourceModel, destinationModel, QModelIndex(), QModelIndex(), checkHeaders);
}